

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

int16_t __thiscall nuraft::buffer_serializer::get_i16(buffer_serializer *this)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  overflow_error *this_00;
  
  sVar4 = this->pos_;
  sVar5 = buffer::size(this->buf_);
  if (sVar4 + 2 <= sVar5) {
    pbVar6 = buffer::data_begin(this->buf_);
    sVar4 = this->pos_;
    pbVar1 = pbVar6 + sVar4;
    pbVar7 = pbVar6 + sVar4 + 1;
    if (this->endian_ != LITTLE) {
      pbVar7 = pbVar1;
      pbVar1 = pbVar6 + sVar4 + 1;
    }
    bVar2 = *pbVar7;
    bVar3 = *pbVar1;
    pos(this,sVar4 + 2);
    return CONCAT11(bVar2,bVar3);
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

int16_t buffer_serializer::get_i16() {
    int16_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get16l(ptr, ret); }
    else                    { get16b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}